

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall UnitTestBasehello5::Run(UnitTestBasehello5 *this)

{
  bool bVar1;
  Regex r;
  UnitTestBase *in_stack_fffffffffffffda8;
  UnitTestBase *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  allocator *paVar2;
  Regex *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdd0;
  undefined2 uVar3;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  undefined1 uVar4;
  UnitTestBase *in_stack_fffffffffffffde0;
  bool local_183;
  allocator local_181;
  string local_180 [37];
  byte local_15b;
  byte local_15a;
  allocator local_159;
  string local_158 [37];
  byte local_133;
  byte local_132;
  allocator local_131;
  string local_130 [37];
  byte local_10b;
  byte local_10a;
  allocator local_109;
  string local_108 [37];
  byte local_e3;
  byte local_e2;
  allocator local_e1;
  string local_e0 [37];
  byte local_bb;
  byte local_ba;
  allocator local_b9;
  string local_b8 [37];
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [37];
  byte local_6b;
  byte local_6a;
  allocator local_69;
  string local_68 [104];
  
  uVar3 = (undefined2)((ulong)in_stack_fffffffffffffdd0 >> 0x30);
  bert::Regex::Regex(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_6a = 0;
  local_6b = 0;
  local_92 = 0;
  local_93 = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_6a = 1;
    std::__cxx11::string::string(local_68,"\'r.Match(\"b\")\'",&local_69);
    local_6b = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffde0,
               (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    std::allocator<char>::allocator();
    local_92 = 1;
    std::__cxx11::string::string(local_90,"\'r.Match(\"b\")\'",&local_91);
    local_93 = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffde0,
               (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if ((local_93 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  if ((local_92 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if ((local_6b & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_6a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  local_ba = 0;
  local_bb = 0;
  local_e2 = 0;
  local_e3 = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_ba = 1;
    std::__cxx11::string::string(local_b8,"\'r.Match(\"bbb\")\'",&local_b9);
    local_bb = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffde0,
               (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string(local_e0,"\'r.Match(\"bbb\")\'",&local_e1);
    local_e3 = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffde0,
               (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if ((local_e3 & 1) != 0) {
    std::__cxx11::string::~string(local_e0);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  if ((local_bb & 1) != 0) {
    std::__cxx11::string::~string(local_b8);
  }
  if ((local_ba & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  local_10a = 0;
  local_10b = 0;
  local_132 = 0;
  local_133 = 0;
  bVar1 = bert::Regex::Match((Regex *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if (bVar1) {
    std::allocator<char>::allocator();
    local_10a = 1;
    std::__cxx11::string::string(local_108,"\'r.Match(\"bbbabc\")\'",&local_109);
    local_10b = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffde0,
               (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
               SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  else {
    std::allocator<char>::allocator();
    local_132 = 1;
    std::__cxx11::string::string(local_130,"\'r.Match(\"bbbabc\")\'",&local_131);
    local_133 = 1;
    in_stack_fffffffffffffde0 =
         UnitTestBase::SetInfo
                   (in_stack_fffffffffffffde0,
                    (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                    SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if ((local_133 & 1) != 0) {
    std::__cxx11::string::~string(local_130);
  }
  if ((local_132 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  if ((local_10b & 1) != 0) {
    std::__cxx11::string::~string(local_108);
  }
  if ((local_10a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  local_15a = 0;
  local_15b = 0;
  local_183 = bert::Regex::Match((Regex *)in_stack_fffffffffffffdb0,
                                 (char *)in_stack_fffffffffffffda8);
  if (local_183) {
    paVar2 = &local_159;
    uVar4 = local_183;
    std::allocator<char>::allocator();
    local_15a = 1;
    std::__cxx11::string::string(local_158,"\'r.Match(\"\")\'",paVar2);
    local_15b = 1;
    UnitTestBase::SetInfo
              (in_stack_fffffffffffffde0,(string *)CONCAT17(uVar4,in_stack_fffffffffffffdd8),
               SUB81((ulong)paVar2 >> 0x38,0),SUB81((ulong)paVar2 >> 0x30,0));
  }
  else {
    paVar2 = &local_181;
    uVar4 = local_183;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"\'r.Match(\"\")\'",paVar2);
    in_stack_fffffffffffffdb0 =
         UnitTestBase::SetInfo
                   (in_stack_fffffffffffffde0,(string *)CONCAT17(uVar4,in_stack_fffffffffffffdd8),
                    SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
  }
  local_183 = !local_183;
  MsgHelper::operator=((MsgHelper *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (local_183) {
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  if ((local_15b & 1) != 0) {
    std::__cxx11::string::~string(local_158);
  }
  if ((local_15a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  bert::Regex::~Regex((Regex *)0x13a445);
  return;
}

Assistant:

TEST_CASE(hello5)
{
    Regex r("(a|b|c)*b*");

    EXPECT_TRUE(r.Match("b"));
    EXPECT_TRUE(r.Match("bbb"));
    EXPECT_TRUE(r.Match("bbbabc"));
    EXPECT_TRUE(r.Match(""));
}